

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmisaac.cpp
# Opt level: O3

void isaac_gen_group(isaacctx *ctx)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t *puVar6;
  ulong uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint32_t *puVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  
  uVar8 = ctx->a;
  uVar3 = ctx->c + 1;
  ctx->c = uVar3;
  uVar3 = uVar3 + ctx->b;
  puVar6 = ctx->mem + 0x80;
  puVar1 = ctx->rsl;
  puVar10 = ctx->mem;
  uVar7 = 0x404;
  do {
    puVar2 = puVar1;
    uVar5 = *puVar10;
    uVar9 = (uVar8 << 0xd ^ uVar8) + *puVar6;
    uVar4 = uVar3 + uVar9 + *(int *)((long)ctx->mem + (ulong)(uVar5 & 0x3fc));
    *puVar10 = uVar4;
    uVar8 = uVar5 + *(int *)((long)ctx->mem + (ulong)(uVar4 >> 8 & 0x3fc));
    *puVar2 = uVar8;
    uVar5 = *(uint *)((long)ctx->rsl + uVar7);
    uVar9 = (uVar9 >> 6 ^ uVar9) + puVar6[1];
    uVar4 = uVar8 + uVar9 + *(int *)((long)ctx->mem + (ulong)(uVar5 & 0x3fc));
    *(uint *)((long)ctx->rsl + uVar7) = uVar4;
    uVar8 = uVar5 + *(int *)((long)ctx->mem + (ulong)(uVar4 >> 8 & 0x3fc));
    puVar2[1] = uVar8;
    uVar5 = *(uint *)((long)ctx->rsl + uVar7 + 4);
    uVar9 = (uVar9 * 4 ^ uVar9) + puVar6[2];
    uVar4 = uVar8 + uVar9 + *(int *)((long)ctx->mem + (ulong)(uVar5 & 0x3fc));
    *(uint *)((long)ctx->rsl + uVar7 + 4) = uVar4;
    uVar3 = uVar5 + *(int *)((long)ctx->mem + (ulong)(uVar4 >> 8 & 0x3fc));
    puVar2[2] = uVar3;
    uVar5 = puVar10[3];
    uVar8 = (uVar9 >> 0x10 ^ uVar9) + puVar6[3];
    uVar4 = uVar3 + uVar8 + *(int *)((long)ctx->mem + (ulong)(uVar5 & 0x3fc));
    puVar6 = puVar6 + 4;
    puVar10[3] = uVar4;
    uVar3 = uVar5 + *(int *)((long)ctx->mem + (ulong)(uVar4 >> 8 & 0x3fc));
    puVar2[3] = uVar3;
    bVar13 = uVar7 < 0x5f4;
    puVar1 = puVar2 + 4;
    puVar10 = (uint32_t *)((long)ctx->rsl + uVar7 + 0xc);
    uVar7 = uVar7 + 0x10;
  } while (bVar13);
  uVar7 = 0x3f4;
  do {
    uVar12 = (uVar8 << 0xd ^ uVar8) + *(int *)((long)ctx->rsl + uVar7 + 0xc);
    uVar5 = *(uint *)((long)puVar2 + uVar7 + 0x1c);
    uVar9 = uVar3 + uVar12 + *(int *)((long)ctx->mem + (ulong)(uVar5 & 0x3fc));
    uVar4 = *(uint *)((long)puVar2 + uVar7 + 0x20);
    *(uint *)((long)puVar2 + uVar7 + 0x1c) = uVar9;
    iVar11 = uVar5 + *(int *)((long)ctx->mem + (ulong)(uVar9 >> 8 & 0x3fc));
    *(int *)((long)puVar2 + (uVar7 - 0x3e4)) = iVar11;
    uVar5 = (uVar12 >> 6 ^ uVar12) + *(int *)((long)ctx->rsl + uVar7 + 0x10);
    uVar9 = iVar11 + uVar5 + *(int *)((long)ctx->mem + (ulong)(uVar4 & 0x3fc));
    *(uint *)((long)puVar2 + uVar7 + 0x20) = uVar9;
    iVar11 = uVar4 + *(int *)((long)ctx->mem + (ulong)(uVar9 >> 8 & 0x3fc));
    *(int *)((long)puVar2 + (uVar7 - 0x3e0)) = iVar11;
    uVar9 = (uVar5 * 4 ^ uVar5) + *(int *)((long)ctx->rsl + uVar7 + 0x14);
    uVar5 = *(uint *)((long)puVar2 + uVar7 + 0x24);
    uVar4 = iVar11 + uVar9 + *(int *)((long)ctx->mem + (ulong)(uVar5 & 0x3fc));
    *(uint *)((long)puVar2 + uVar7 + 0x24) = uVar4;
    iVar11 = uVar5 + *(int *)((long)ctx->mem + (ulong)(uVar4 >> 8 & 0x3fc));
    *(int *)((long)puVar2 + (uVar7 - 0x3dc)) = iVar11;
    uVar5 = *(uint *)((long)puVar2 + uVar7 + 0x28);
    uVar8 = (uVar9 >> 0x10 ^ uVar9) + *(int *)((long)ctx->rsl + uVar7 + 0x18);
    uVar4 = iVar11 + uVar8 + *(int *)((long)ctx->mem + (ulong)(uVar5 & 0x3fc));
    *(uint *)((long)puVar2 + uVar7 + 0x28) = uVar4;
    uVar3 = uVar5 + *(int *)((long)ctx->mem + (ulong)(uVar4 >> 8 & 0x3fc));
    *(uint32_t *)((long)puVar2 + (uVar7 - 0x3d8)) = uVar3;
    uVar7 = uVar7 + 0x10;
  } while (uVar7 < 0x5f4);
  ctx->b = uVar3;
  ctx->a = uVar8;
  return;
}

Assistant:

void isaac_gen_group(isaacctx *ctx)
{
    uint32_t a;
    uint32_t b;
    uint32_t x;
    uint32_t y;
    uint32_t *m;
    uint32_t *mm;
    uint32_t *m2;
    uint32_t *r;
    uint32_t *mend;

    mm = ctx->mem;
    r = ctx->rsl;
    a = ctx->a;
    b = (ctx->b + (++ctx->c)) & 0xffffffff;
    for (m = mm, mend = m2 = m + (ISAAC_RANDSIZ/2) ; m<mend ; )
    {
        isaac_step(a<<13, a, b, mm, m, m2, r, x);
        isaac_step(a>>6,  a, b, mm, m, m2, r, x);
        isaac_step(a<<2,  a, b, mm, m, m2, r, x);
        isaac_step(a>>16, a, b, mm, m, m2, r, x);
    }
    for (m2 = mm; m2<mend; )
    {
        isaac_step(a<<13, a, b, mm, m, m2, r, x);
        isaac_step(a>>6,  a, b, mm, m, m2, r, x);
        isaac_step(a<<2,  a, b, mm, m, m2, r, x);
        isaac_step(a>>16, a, b, mm, m, m2, r, x);
    }
    ctx->b = b;
    ctx->a = a;
}